

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::queryReplaceOrder(Application *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Application *this_00;
  Message replace;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0 [20];
  Message local_168 [344];
  
  iVar3 = queryVersion(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nCancelReplaceRequest\n",0x16);
  FIX::Message::Message(local_168);
  switch(iVar3) {
  case 0x28:
    queryCancelReplaceRequest40((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x29:
    queryCancelReplaceRequest41((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2a:
    queryCancelReplaceRequest42((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2b:
    queryCancelReplaceRequest43((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2c:
    queryCancelReplaceRequest44((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No test for version ",0x14);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    goto LAB_00120349;
  case 0x32:
    queryCancelReplaceRequest50((OrderCancelReplaceRequest *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
  }
  FIX::Message::~Message((Message *)local_2c0);
LAB_00120349:
  pp_Var1 = (_func_int **)(local_2c0 + 0x10);
  this_00 = (Application *)local_2c0;
  local_2c0._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"Send replace","");
  bVar2 = queryConfirm(this_00,(string *)local_2c0);
  if ((_func_int **)local_2c0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2c0._0_8_,local_2b0[0]._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_2c0._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
    FIX::Session::sendToTarget(local_168,(string *)local_2c0);
    if ((_func_int **)local_2c0._0_8_ != pp_Var1) {
      operator_delete((void *)local_2c0._0_8_,local_2b0[0]._M_allocated_capacity + 1);
    }
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryReplaceOrder() {
  int version = queryVersion();
  std::cout << "\nCancelReplaceRequest\n";
  FIX::Message replace;

  switch (version) {
  case 40:
    replace = queryCancelReplaceRequest40();
    break;
  case 41:
    replace = queryCancelReplaceRequest41();
    break;
  case 42:
    replace = queryCancelReplaceRequest42();
    break;
  case 43:
    replace = queryCancelReplaceRequest43();
    break;
  case 44:
    replace = queryCancelReplaceRequest44();
    break;
  case 50:
    replace = queryCancelReplaceRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send replace")) {
    FIX::Session::sendToTarget(replace);
  }
}